

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::OP_GetPropertyForTypeOfScoped<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout)

{
  uint localRegisterID;
  InlineCacheIndex inlineCacheIndex;
  ImplicitCallFlags flags;
  bool bVar1;
  uint16 uVar2;
  PropertyId PVar3;
  ScriptContext *pSVar4;
  ThreadContext *this_00;
  FrameDisplay *pFVar5;
  InlineCache *pIVar6;
  FunctionBody *pFVar7;
  Var pvVar8;
  Var local_98;
  Var value;
  PropertyValueInfo info;
  DynamicObject *obj;
  int length;
  ScriptContext *scriptContext;
  InlineCache *inlineCache;
  FrameDisplay *pScope;
  PropertyId propertyId;
  ImplicitCallFlags savedImplicitCallFlags;
  ThreadContext *threadContext;
  OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout_local;
  InterpreterStackFrame *this_local;
  
  pSVar4 = GetScriptContext(this);
  this_00 = ScriptContext::GetThreadContext(pSVar4);
  flags = ThreadContext::GetImplicitCallFlags(this_00);
  ThreadContext::ClearImplicitCallFlags(this_00);
  PVar3 = GetPropertyIdFromCacheId(this,playout->inlineCacheIndex);
  pFVar5 = GetEnvForEvalCode(this);
  pIVar6 = GetInlineCache(this,playout->inlineCacheIndex);
  pSVar4 = GetScriptContext(this);
  uVar2 = FrameDisplay::GetLength(pFVar5);
  if (uVar2 == 1) {
    info._56_8_ = FrameDisplay::GetItem(pFVar5,0);
    PropertyValueInfo::PropertyValueInfo((PropertyValueInfo *)&value);
    pFVar7 = GetFunctionBody(this);
    PropertyValueInfo::SetCacheInfo
              ((PropertyValueInfo *)&value,pFVar7,pIVar6,playout->inlineCacheIndex,true);
    bVar1 = CacheOperators::
            TryGetProperty<true,false,false,false,false,false,true,false,false,false>
                      ((Var)info._56_8_,false,(RecyclableObject *)info._56_8_,PVar3,&local_98,pSVar4
                       ,(PropertyCacheOperationInfo *)0x0,(PropertyValueInfo *)&value);
    if (bVar1) {
      ThreadContext::CheckAndResetImplicitCallAccessorFlag(this_00);
      ThreadContext::AddImplicitCallFlags(this_00,flags);
      SetReg<unsigned_int>(this,playout->Value,local_98);
      return;
    }
  }
  localRegisterID = playout->Value;
  pFVar7 = GetFunctionBody(this);
  pIVar6 = GetInlineCache(this,playout->inlineCacheIndex);
  inlineCacheIndex = playout->inlineCacheIndex;
  pFVar5 = GetEnvForEvalCode(this);
  PVar3 = GetPropertyIdFromCacheId(this,playout->inlineCacheIndex);
  pvVar8 = GetReg<unsigned_int>(this,1);
  pvVar8 = Js::JavascriptOperators::PatchGetPropertyForTypeOfScoped<false,Js::InlineCache>
                     (pFVar7,pIVar6,inlineCacheIndex,pFVar5,PVar3,pvVar8);
  SetReg<unsigned_int>(this,localRegisterID,pvVar8);
  ThreadContext::CheckAndResetImplicitCallAccessorFlag(this_00);
  ThreadContext::AddImplicitCallFlags(this_00,flags);
  return;
}

Assistant:

void InterpreterStackFrame::OP_GetPropertyForTypeOfScoped(const unaligned OpLayoutT_ElementP<T>* playout)
    {
        ThreadContext* threadContext = this->GetScriptContext()->GetThreadContext();
        ImplicitCallFlags savedImplicitCallFlags = threadContext->GetImplicitCallFlags();
        threadContext->ClearImplicitCallFlags();

        // Get the property, using a scope stack rather than an individual instance.
        // Use the cache
        PropertyId propertyId = GetPropertyIdFromCacheId(playout->inlineCacheIndex);
        FrameDisplay *pScope = this->GetEnvForEvalCode();
        InlineCache *inlineCache = this->GetInlineCache(playout->inlineCacheIndex);
        ScriptContext* scriptContext = GetScriptContext();
        int length = pScope->GetLength();
        if (1 == length)
        {
            DynamicObject *obj = (DynamicObject*)pScope->GetItem(0);
            PropertyValueInfo info;
            PropertyValueInfo::SetCacheInfo(&info, GetFunctionBody(), inlineCache, playout->inlineCacheIndex, true);
            Var value;
            if (CacheOperators::TryGetProperty<true, false, false, false, false, false, true, false, false, false>(
                obj, false, obj, propertyId, &value, scriptContext, nullptr, &info))
            {
                threadContext->CheckAndResetImplicitCallAccessorFlag();
                threadContext->AddImplicitCallFlags(savedImplicitCallFlags);

                SetReg(playout->Value, value);
                return;
            }
        }

        SetReg(
            playout->Value,
            JavascriptOperators::PatchGetPropertyForTypeOfScoped<false>(
                GetFunctionBody(),
                GetInlineCache(playout->inlineCacheIndex),
                playout->inlineCacheIndex,
                GetEnvForEvalCode(),
                GetPropertyIdFromCacheId(playout->inlineCacheIndex),
                GetReg(Js::FunctionBody::RootObjectRegSlot)));

        threadContext->CheckAndResetImplicitCallAccessorFlag();
        threadContext->AddImplicitCallFlags(savedImplicitCallFlags);
    }